

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extralev.c
# Opt level: O0

void makeroguerooms(level *lev)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  int iVar7;
  int y_00;
  int hiy;
  int hix;
  int lowy;
  int lowx;
  int y;
  int x;
  level *lev_local;
  
  lev->nroom = 0;
  for (lowy = 0; lowy < 3; lowy = lowy + 1) {
    for (lowx = 0; lowx < 3; lowx = lowx + 1) {
      iVar7 = rn2(5);
      if ((iVar7 == 0) && ((lev->nroom != 0 || ((lowx < 2 && (lowy < 2)))))) {
        r[lowx][lowy].real = '\0';
        iVar7 = rn2(0x16);
        r[lowx][lowy].rlx = (char)iVar7 + '\x02';
        iVar7 = 3;
        if (lowy == 2) {
          iVar7 = 4;
        }
        iVar7 = rn2(iVar7);
        r[lowx][lowy].rly = (char)iVar7 + '\x02';
      }
      else {
        r[lowx][lowy].real = '\x01';
        iVar7 = rn2(0x16);
        r[lowx][lowy].dx = (char)iVar7 + '\x02';
        iVar7 = 3;
        if (lowy == 2) {
          iVar7 = 4;
        }
        iVar7 = rn2(iVar7);
        r[lowx][lowy].dy = (char)iVar7 + '\x02';
        iVar7 = rnd(0x18 - r[lowx][lowy].dx);
        r[lowx][lowy].rlx = (xchar)iVar7;
        iVar7 = 4;
        if (lowy == 2) {
          iVar7 = 5;
        }
        iVar7 = rnd((iVar7 - r[lowx][lowy].dy) + 1);
        r[lowx][lowy].rly = (xchar)iVar7;
        lev->nroom = lev->nroom + 1;
      }
      r[lowx][lowy].doortable = '\0';
    }
  }
  iVar7 = rn2(3);
  y_00 = rn2(3);
  miniwalk(iVar7,y_00);
  lev->nroom = 0;
  for (lowy = 0; lowy < 3; lowy = lowy + 1) {
    for (lowx = 0; lowx < 3; lowx = lowx + 1) {
      if (r[lowx][lowy].real != '\0') {
        r[lowx][lowy].nroom = lev->nroom;
        smeq[lev->nroom] = lev->nroom;
        cVar1 = r[lowx][lowy].rlx;
        cVar2 = r[lowx][lowy].rly;
        cVar3 = r[lowx][lowy].rlx;
        cVar4 = r[lowx][lowy].dx;
        cVar5 = r[lowx][lowy].rly;
        cVar6 = r[lowx][lowy].dy;
        iVar7 = rn2(7);
        add_room(lev,lowx * 0x1a + 1 + (int)cVar1,lowy * 7 + (int)cVar2,
                 lowx * 0x1a + (int)cVar3 + (int)cVar4,lowy * 7 + (int)cVar5 + (int)cVar6 + -1,
                 (iVar7 != 0 ^ 0xffU) & 1,'\0','\0');
      }
    }
  }
  for (lowy = 0; lowy < 3; lowy = lowy + 1) {
    for (lowx = 0; lowx < 3; lowx = lowx + 1) {
      if ((r[lowx][lowy].doortable & 2) != 0) {
        roguecorr(lev,lowx,lowy,2);
      }
      if ((r[lowx][lowy].doortable & 8) != 0) {
        roguecorr(lev,lowx,lowy,8);
      }
      if ((r[lowx][lowy].doortable & 4) != 0) {
        impossible("left end of %d, %d never connected?",(ulong)(uint)lowx,(ulong)(uint)lowy);
      }
      if ((r[lowx][lowy].doortable & 1) != 0) {
        impossible("up end of %d, %d never connected?",(ulong)(uint)lowx,(ulong)(uint)lowy);
      }
    }
  }
  return;
}

Assistant:

void makeroguerooms(struct level *lev) {
	int x,y;
	/* Rogue levels are structured 3 by 3, with each section containing
	 * a room or an intersection.  The minimum width is 2 each way.
	 * One difference between these and "real" Rogue levels: real Rogue
	 * uses 24 rows and this game only 23.  So we cheat a bit by making
	 * the second row of rooms not as deep.
	 *
	 * Each normal space has 6/7 rows and 25 columns in which a room may
	 * actually be placed.  Walls go from rows 0-5/6 and columns 0-24.
	 * Not counting walls, the room may go in
	 * rows 1-5 and columns 1-23 (numbering starting at 0).  A room
	 * coordinate of this type may be converted to a level coordinate
	 * by adding 1+28*x to the column, and 7*y to the row.  (The 1
	 * is because column 0 isn't used [we only use 1-78]).
	 * Room height may be 2-4 (2-5 on last row), length 2-23 (not
	 * counting walls)
	 */
#define here r[x][y]

	lev->nroom = 0;
	for (y=0; y<3; y++) for(x=0; x<3; x++) {
		/* Note: we want to insure at least 1 room.  So, if the
		 * first 8 are all dummies, force the last to be a room.
		 */
		if (!rn2(5) && (lev->nroom || (x<2 && y<2))) {
			/* Arbitrary: dummy rooms may only go where real
			 * ones do.
			 */
			here.real = FALSE;
			here.rlx = rn1(22, 2);
			here.rly = rn1((y==2)?4:3, 2);
		} else {
			here.real = TRUE;
			here.dx = rn1(22, 2); /* 2-23 long, plus walls */
			here.dy = rn1((y==2)?4:3, 2); /* 2-5 high, plus walls */

			/* boundaries of room floor */
			here.rlx = rnd(23 - here.dx + 1);
			here.rly = rnd(((y==2) ? 5 : 4)- here.dy + 1);
			lev->nroom++;
		}
		here.doortable = 0;
	}
	x = rn2(3);
	y = rn2(3);
	miniwalk(x, y);
	lev->nroom = 0;
	for (y=0; y<3; y++) for(x=0; x<3; x++) {
		if (here.real) { /* Make a room */
			int lowx, lowy, hix, hiy;

			r[x][y].nroom = lev->nroom;
			smeq[lev->nroom] = lev->nroom;

			lowx = 1 + 26*x + here.rlx;
			lowy = 7*y + here.rly;
			hix = 1 + 26*x + here.rlx + here.dx - 1;
			hiy = 7*y + here.rly + here.dy - 1;
			/* Strictly speaking, it should be lit only if above
			 * level 10, but since Rogue rooms are only
			 * encountered below level 10, use !rn2(7).
			 */
			add_room(lev, lowx, lowy, hix, hiy,
				 (boolean) !rn2(7), OROOM, FALSE);
		}
	}

	/* Now, add connecting corridors. */
	for (y=0; y<3; y++) for(x=0; x<3; x++) {
		if (here.doortable & DOWN)
			roguecorr(lev, x, y, DOWN);
		if (here.doortable & RIGHT)
			roguecorr(lev, x, y, RIGHT);
		if (here.doortable & LEFT)
			impossible ("left end of %d, %d never connected?",x,y);
		if (here.doortable & UP)
			impossible ("up end of %d, %d never connected?",x,y);
	}
}